

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

void __thiscall
Environment::putFunction(Environment *this,Identifier *ident,Scope scope,ptr<Function> *function)

{
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2> local_80;
  Identifier local_70;
  Symbol symbol;
  
  std::__cxx11::string::string((string *)&local_70,(string *)ident);
  Symbol::Symbol(&symbol,&local_70,true,scope);
  std::__cxx11::string::~string((string *)&local_70);
  std::dynamic_pointer_cast<Member,Function>((shared_ptr<Function> *)&local_80);
  this_00 = &std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&symbol)->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  Symbol::~Symbol(&symbol);
  return;
}

Assistant:

void Environment::putFunction(const Identifier &ident, Scope scope, ptr<Function> function) {
    Symbol symbol(ident, true, scope);
    symbols[symbol] = std::dynamic_pointer_cast<Member>(function);
}